

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-walker.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  Port *pPVar2;
  uint uVar3;
  allocator<char> local_449;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  char buffer [1024];
  
  memset(buffer,0,0x400);
  uVar3 = 1;
  rtosc::walk_ports(&ports,buffer,0x400,(void *)0x0,
                    main::$_0::__invoke(rtosc::Port_const*,char_const*,char_const*,rtosc::
                    Ports_const__void__void__,true,(void *)0x0,false);
  pPVar2 = rtosc::Ports::apropos(&ports,"/subtree/port");
  if (pPVar2 != (Port *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,pPVar2->name,&local_449)
    ;
    bVar1 = std::operator==(&local_448,"port");
    std::__cxx11::string::~string((string *)&local_448);
    uVar3 = (uint)!bVar1;
  }
  return uVar3;
}

Assistant:

int main()
{
    char buffer[1024];
    memset(buffer, 0, sizeof(buffer));
    walk_ports(&ports, 
            buffer, 1024, NULL,
            [](const Port*, const char *name, const char*,
               const Ports&, void *, void*) {
                puts(name);
            });

    const Port *p = ports.apropos("/subtree/port");

    if(p && (std::string(p->name) == "port"))
        return 0;
    return 1;
}